

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
               (double *begin,double *end,int param_3,uint param_4)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  undefined4 uVar20;
  double __tmp;
  undefined4 uVar21;
  double __tmp_1;
  double dVar22;
  int local_88;
  uint local_84;
  _DistanceType __len;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  
  pdVar13 = end + -3;
  local_84 = param_4;
  local_88 = param_3;
LAB_002dd270:
  do {
    lVar19 = (long)end - (long)begin;
    uVar9 = lVar19 / 0x18;
    if (lVar19 < 0x240) {
      if ((local_84 & 1) == 0) {
        if (begin != end) {
          pdVar13 = begin + 4;
          while (begin + 3 != end) {
            dVar2 = *begin;
            uVar20 = SUB84(dVar2,0);
            uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
            dVar3 = begin[3];
            if (dVar2 < dVar3) {
              dVar2 = begin[4];
              dVar5 = begin[5];
              pdVar15 = pdVar13;
              do {
                pdVar16 = pdVar15;
                pdVar16[-1] = (double)CONCAT44(uVar21,uVar20);
                *pdVar16 = pdVar16[-3];
                pdVar16[1] = pdVar16[-2];
                dVar22 = pdVar16[-7];
                uVar20 = SUB84(dVar22,0);
                uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
                pdVar15 = pdVar16 + -3;
              } while (dVar22 < dVar3);
              pdVar16[-4] = dVar3;
              pdVar16[-3] = dVar2;
              pdVar16[-2] = dVar5;
            }
            pdVar13 = pdVar13 + 3;
            begin = begin + 3;
          }
        }
      }
      else if (begin != end) {
        lVar19 = 0;
        pdVar13 = begin;
        while (pdVar15 = pdVar13 + 3, pdVar15 != end) {
          dVar2 = *pdVar13;
          uVar20 = SUB84(dVar2,0);
          uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
          dVar3 = pdVar13[3];
          if (dVar2 < dVar3) {
            dVar2 = pdVar13[4];
            dVar5 = pdVar13[5];
            lVar10 = lVar19;
            pdVar13 = pdVar15;
            do {
              pdVar16 = pdVar13;
              *pdVar16 = (double)CONCAT44(uVar21,uVar20);
              pdVar16[1] = pdVar16[-2];
              pdVar16[2] = pdVar16[-1];
              pdVar13 = begin;
              if (lVar10 == 0) break;
              pdVar13 = pdVar16 + -3;
              dVar22 = pdVar16[-6];
              uVar20 = SUB84(dVar22,0);
              uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
              lVar10 = lVar10 + 0x18;
            } while (dVar22 < dVar3);
            *pdVar13 = dVar3;
            pdVar16[-2] = dVar2;
            pdVar16[-1] = dVar5;
          }
          lVar19 = lVar19 + -0x18;
          pdVar13 = pdVar15;
        }
      }
      return;
    }
    uVar14 = uVar9 >> 1;
    pdVar15 = begin + uVar14 * 3;
    if (uVar9 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                (pdVar15,begin,pdVar13);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                (begin,pdVar15,pdVar13);
      sort3<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                (begin + 3,begin + uVar14 * 3 + -3,end + -6);
      sort3<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                (begin + 6,begin + uVar14 * 3 + 3,end + -9);
      sort3<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                (begin + uVar14 * 3 + -3,pdVar15,begin + uVar14 * 3 + 3);
      dVar2 = *begin;
      *begin = *pdVar15;
      *pdVar15 = dVar2;
      dVar2 = begin[1];
      dVar3 = begin[2];
      dVar5 = pdVar15[2];
      begin[1] = pdVar15[1];
      begin[2] = dVar5;
      pdVar15[1] = dVar2;
      pdVar15[2] = dVar3;
    }
    dVar2 = *begin;
    if (((local_84 & 1) == 0) && (begin[-3] <= dVar2)) {
      dVar3 = begin[1];
      dVar5 = begin[2];
      lVar19 = 0;
      do {
        dVar22 = *(double *)((long)end + lVar19 + -0x18);
        uVar20 = SUB84(dVar22,0);
        uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
        lVar19 = lVar19 + -0x18;
      } while (dVar22 < dVar2);
      pdVar15 = (double *)((long)end + lVar19);
      pdVar16 = begin;
      dVar22 = dVar2;
      if (lVar19 == -0x18) {
        do {
          if (pdVar15 <= pdVar16) break;
          dVar22 = pdVar16[3];
          pdVar16 = pdVar16 + 3;
        } while (dVar2 <= dVar22);
      }
      else {
        do {
          dVar22 = pdVar16[3];
          pdVar16 = pdVar16 + 3;
        } while (dVar2 <= dVar22);
      }
      while (pdVar16 < pdVar15) {
        *pdVar16 = (double)CONCAT44(uVar21,uVar20);
        *pdVar15 = dVar22;
        dVar22 = pdVar16[1];
        dVar6 = pdVar16[2];
        dVar7 = pdVar15[2];
        pdVar16[1] = pdVar15[1];
        pdVar16[2] = dVar7;
        pdVar15[1] = dVar22;
        pdVar15[2] = dVar6;
        do {
          dVar22 = pdVar15[-3];
          uVar20 = SUB84(dVar22,0);
          uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
          pdVar15 = pdVar15 + -3;
        } while (dVar22 < dVar2);
        do {
          dVar22 = pdVar16[3];
          pdVar16 = pdVar16 + 3;
        } while (dVar2 <= dVar22);
      }
      *begin = (double)CONCAT44(uVar21,uVar20);
      dVar22 = pdVar15[2];
      begin[1] = pdVar15[1];
      begin[2] = dVar22;
      *pdVar15 = dVar2;
      local_78 = SUB84(dVar3,0);
      uStack_74 = (undefined4)((ulong)dVar3 >> 0x20);
      uStack_70 = SUB84(dVar5,0);
      uStack_6c = (undefined4)((ulong)dVar5 >> 0x20);
      *(undefined4 *)(pdVar15 + 1) = local_78;
      *(undefined4 *)((long)pdVar15 + 0xc) = uStack_74;
      *(undefined4 *)(pdVar15 + 2) = uStack_70;
      *(undefined4 *)((long)pdVar15 + 0x14) = uStack_6c;
      begin = pdVar15 + 3;
      goto LAB_002dd270;
    }
    pdVar15 = begin + 1;
    dVar3 = begin[1];
    dVar5 = begin[2];
    lVar10 = 0;
    do {
      dVar22 = *(double *)((long)begin + lVar10 + 0x18);
      uVar20 = SUB84(dVar22,0);
      uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
      lVar10 = lVar10 + 0x18;
    } while (dVar2 < dVar22);
    pdVar16 = (double *)((long)begin + lVar10);
    pdVar11 = end;
    pdVar17 = pdVar16;
    if (lVar10 == 0x18) {
      do {
        pdVar18 = pdVar11;
        if (pdVar11 <= pdVar16) break;
        pdVar1 = pdVar11 + -3;
        pdVar11 = pdVar11 + -3;
        pdVar18 = pdVar11;
      } while (*pdVar1 <= dVar2);
    }
    else {
      do {
        pdVar1 = pdVar11 + -3;
        pdVar11 = pdVar11 + -3;
        pdVar18 = pdVar11;
      } while (*pdVar1 <= dVar2);
    }
    while (pdVar17 < pdVar11) {
      *pdVar17 = *pdVar11;
      *pdVar11 = (double)CONCAT44(uVar21,uVar20);
      dVar22 = pdVar17[1];
      dVar6 = pdVar17[2];
      dVar7 = pdVar11[2];
      pdVar17[1] = pdVar11[1];
      pdVar17[2] = dVar7;
      pdVar11[1] = dVar22;
      pdVar11[2] = dVar6;
      do {
        dVar22 = pdVar17[3];
        uVar20 = SUB84(dVar22,0);
        uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
        pdVar17 = pdVar17 + 3;
      } while (dVar2 < dVar22);
      do {
        pdVar1 = pdVar11 + -3;
        pdVar11 = pdVar11 + -3;
      } while (*pdVar1 <= dVar2);
    }
    pdVar11 = pdVar17 + -3;
    *begin = pdVar17[-3];
    uVar20 = *(undefined4 *)((long)pdVar17 + -0xc);
    uVar21 = *(undefined4 *)(pdVar17 + -1);
    uVar4 = *(undefined4 *)((long)pdVar17 + -4);
    *(undefined4 *)pdVar15 = *(undefined4 *)(pdVar17 + -2);
    *(undefined4 *)((long)begin + 0xc) = uVar20;
    *(undefined4 *)(begin + 2) = uVar21;
    *(undefined4 *)((long)begin + 0x14) = uVar4;
    pdVar17[-3] = dVar2;
    local_78 = SUB84(dVar3,0);
    uStack_74 = (undefined4)((ulong)dVar3 >> 0x20);
    uStack_70 = SUB84(dVar5,0);
    uStack_6c = (undefined4)((ulong)dVar5 >> 0x20);
    *(undefined4 *)(pdVar17 + -2) = local_78;
    *(undefined4 *)((long)pdVar17 + -0xc) = uStack_74;
    *(undefined4 *)(pdVar17 + -1) = uStack_70;
    *(undefined4 *)((long)pdVar17 + -4) = uStack_6c;
    uVar14 = ((long)pdVar11 - (long)begin) / 0x18;
    uVar12 = ((long)end - (long)pdVar17) / 0x18;
    if (((long)uVar14 < (long)(uVar9 >> 3)) || ((long)uVar12 < (long)(uVar9 >> 3))) {
      local_88 = local_88 + -1;
      if (local_88 == 0) {
        uVar14 = uVar9 - 2 >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                    (begin,uVar14,uVar9);
          bVar8 = uVar14 != 0;
          uVar14 = uVar14 - 1;
        } while (bVar8);
        while (0x18 < lVar19) {
          *pdVar13 = *begin;
          dVar2 = begin[2];
          pdVar13[1] = *pdVar15;
          pdVar13[2] = dVar2;
          lVar19 = lVar19 + -0x18;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                    (begin,0,lVar19 / 0x18);
          pdVar13 = pdVar13 + -3;
        }
        return;
      }
      if (0x228 < (long)pdVar11 - (long)begin) {
        uVar9 = uVar14 >> 2;
        dVar2 = *begin;
        *begin = begin[uVar9 * 3];
        begin[uVar9 * 3] = dVar2;
        dVar2 = *pdVar15;
        dVar3 = begin[2];
        dVar5 = (begin + uVar9 * 3 + 1)[1];
        *pdVar15 = begin[uVar9 * 3 + 1];
        begin[2] = dVar5;
        begin[uVar9 * 3 + 1] = dVar2;
        (begin + uVar9 * 3 + 1)[1] = dVar3;
        dVar2 = pdVar17[-6];
        pdVar17[-6] = pdVar11[uVar9 * -3];
        pdVar11[uVar9 * -3] = dVar2;
        dVar2 = pdVar17[-5];
        dVar3 = pdVar17[-4];
        dVar5 = (pdVar17 + uVar9 * -3 + -2)[1];
        pdVar17[-5] = pdVar17[uVar9 * -3 + -2];
        pdVar17[-4] = dVar5;
        pdVar17[uVar9 * -3 + -2] = dVar2;
        (pdVar17 + uVar9 * -3 + -2)[1] = dVar3;
        if (0x80 < uVar14) {
          dVar2 = begin[3];
          begin[3] = begin[uVar9 * 3 + 3];
          begin[uVar9 * 3 + 3] = dVar2;
          dVar2 = begin[4];
          dVar3 = begin[5];
          dVar5 = (begin + uVar9 * 3 + 4)[1];
          begin[4] = begin[uVar9 * 3 + 4];
          begin[5] = dVar5;
          begin[uVar9 * 3 + 4] = dVar2;
          (begin + uVar9 * 3 + 4)[1] = dVar3;
          dVar2 = begin[6];
          begin[6] = begin[uVar9 * 3 + 6];
          begin[uVar9 * 3 + 6] = dVar2;
          dVar2 = begin[7];
          dVar3 = begin[8];
          dVar5 = (begin + uVar9 * 3 + 7)[1];
          begin[7] = begin[uVar9 * 3 + 7];
          begin[8] = dVar5;
          begin[uVar9 * 3 + 7] = dVar2;
          (begin + uVar9 * 3 + 7)[1] = dVar3;
          uVar14 = ~uVar9;
          dVar2 = pdVar17[-9];
          pdVar17[-9] = pdVar11[uVar14 * 3];
          pdVar11[uVar14 * 3] = dVar2;
          dVar2 = pdVar17[-8];
          dVar3 = pdVar17[-7];
          dVar5 = (pdVar17 + uVar14 * 3 + -2)[1];
          pdVar17[-8] = pdVar17[uVar14 * 3 + -2];
          pdVar17[-7] = dVar5;
          pdVar17[uVar14 * 3 + -2] = dVar2;
          (pdVar17 + uVar14 * 3 + -2)[1] = dVar3;
          lVar19 = -2 - uVar9;
          dVar2 = pdVar17[-0xc];
          pdVar17[-0xc] = pdVar11[lVar19 * 3];
          pdVar11[lVar19 * 3] = dVar2;
          dVar2 = pdVar17[-0xb];
          dVar3 = pdVar17[-10];
          dVar5 = (pdVar17 + lVar19 * 3 + -2)[1];
          pdVar17[-0xb] = pdVar17[lVar19 * 3 + -2];
          pdVar17[-10] = dVar5;
          pdVar17[lVar19 * 3 + -2] = dVar2;
          (pdVar17 + lVar19 * 3 + -2)[1] = dVar3;
        }
      }
      if (0x228 < (long)end - (long)pdVar17) {
        uVar9 = uVar12 >> 2;
        dVar2 = *pdVar17;
        *pdVar17 = pdVar17[uVar9 * 3];
        pdVar17[uVar9 * 3] = dVar2;
        dVar2 = pdVar17[1];
        dVar3 = pdVar17[2];
        dVar5 = (pdVar17 + uVar9 * 3 + 1)[1];
        pdVar17[1] = pdVar17[uVar9 * 3 + 1];
        pdVar17[2] = dVar5;
        pdVar17[uVar9 * 3 + 1] = dVar2;
        (pdVar17 + uVar9 * 3 + 1)[1] = dVar3;
        dVar2 = end[-3];
        end[-3] = end[uVar9 * -3];
        end[uVar9 * -3] = dVar2;
        dVar2 = end[-2];
        dVar3 = end[-1];
        dVar5 = (end + uVar9 * -3 + 1)[1];
        end[-2] = end[uVar9 * -3 + 1];
        end[-1] = dVar5;
        end[uVar9 * -3 + 1] = dVar2;
        (end + uVar9 * -3 + 1)[1] = dVar3;
        if (0x80 < uVar12) {
          dVar2 = pdVar17[3];
          pdVar17[3] = pdVar17[uVar9 * 3 + 3];
          pdVar17[uVar9 * 3 + 3] = dVar2;
          dVar2 = pdVar17[4];
          dVar3 = pdVar17[5];
          dVar5 = (pdVar17 + uVar9 * 3 + 4)[1];
          pdVar17[4] = pdVar17[uVar9 * 3 + 4];
          pdVar17[5] = dVar5;
          pdVar17[uVar9 * 3 + 4] = dVar2;
          (pdVar17 + uVar9 * 3 + 4)[1] = dVar3;
          dVar2 = pdVar17[6];
          pdVar17[6] = pdVar17[uVar9 * 3 + 6];
          pdVar17[uVar9 * 3 + 6] = dVar2;
          dVar2 = pdVar17[7];
          dVar3 = pdVar17[8];
          dVar5 = (pdVar17 + uVar9 * 3 + 7)[1];
          pdVar17[7] = pdVar17[uVar9 * 3 + 7];
          pdVar17[8] = dVar5;
          pdVar17[uVar9 * 3 + 7] = dVar2;
          (pdVar17 + uVar9 * 3 + 7)[1] = dVar3;
          uVar14 = ~uVar9;
          dVar2 = end[-6];
          end[-6] = end[uVar14 * 3];
          end[uVar14 * 3] = dVar2;
          dVar2 = end[-5];
          dVar3 = end[-4];
          dVar5 = (end + uVar14 * 3 + 1)[1];
          end[-5] = end[uVar14 * 3 + 1];
          end[-4] = dVar5;
          end[uVar14 * 3 + 1] = dVar2;
          (end + uVar14 * 3 + 1)[1] = dVar3;
          lVar19 = -2 - uVar9;
          dVar2 = end[-9];
          end[-9] = end[lVar19 * 3];
          end[lVar19 * 3] = dVar2;
          dVar2 = end[-8];
          dVar3 = end[-7];
          dVar5 = (end + lVar19 * 3 + 1)[1];
          end[-8] = end[lVar19 * 3 + 1];
          end[-7] = dVar5;
          end[lVar19 * 3 + 1] = dVar2;
          (end + lVar19 * 3 + 1)[1] = dVar3;
        }
      }
    }
    else if (((pdVar18 <= pdVar16) &&
             (bVar8 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                                (begin,pdVar11), bVar8)) &&
            (bVar8 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
                               (pdVar17,end), bVar8)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
              (begin,pdVar11,local_88,local_84 & 1);
    local_84 = 0;
    begin = pdVar17;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }